

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O2

compile_errcode __thiscall ConstantDefinition::Generate(ConstantDefinition *this)

{
  bool bVar1;
  SymbolName SVar2;
  undefined4 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar3) {
    case 0:
      uVar3 = 1;
      if (SVar2 != CONST_SYM) {
        return -1;
      }
      break;
    case 1:
      if ((SVar2 & ~SWITCH_SYM) != INT_SYM) {
        return -0x7d8;
      }
      this->m_type = SVar2;
      uVar3 = 2;
      break;
    case 2:
      if (SVar2 != IDENTIFIER_SYM) {
        return -1;
      }
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&local_50,handle_correct_queue);
      std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = SymbolTableTree::FindTerm(symbol_table_tree,&this->m_identifier_name,true);
      if (bVar1) {
        this->m_valid = false;
      }
      else {
        this->m_valid = true;
      }
      uVar3 = 3;
      break;
    case 3:
      uVar3 = 4;
      if (SVar2 != ASSIGN_SYM) {
        return -1;
      }
      break;
    case 4:
      uVar3 = 5;
      if ((SVar2 != CHARACTER_SYM) && (SVar2 != INTERGER_SYM)) {
        return -1;
      }
      break;
    case 5:
      uVar3 = 2;
      if (SVar2 != COMMA_SYM) {
        if (SVar2 != SEMICOLON_SYM) {
          return -1;
        }
        uVar3 = 6;
      }
      break;
    case 6:
      return 0;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode ConstantDefinition::Generate() {
    int state = 0;
    int ret = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == CONST_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (IsValidVariableType(name)) {
                    state = 2;
                    m_type = name;
                    break;
                } else {
                    return INVALID_TYPE_ERROR;
                }
            }
            case 2: {
                if (name == IDENTIFIER_SYM) {
                    state = 3;
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        m_valid = false;
                    } else {
                        m_valid = true;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == ASSIGN_SYM) {
                    state = 4;
                } else {
                    return NOT_MATCH;
                }
                break;
            }
            case 4: {
                if (name == INTERGER_SYM || name == CHARACTER_SYM) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == COMMA_SYM) {
                    state = 2;
                } else if (name == SEMICOLON_SYM) {
                    state = 6;
                } else {
                   return NOT_MATCH;
                }
                break;
            }
            case 6: return COMPILE_OK;
        }
        handle_correct_queue->NextSymbol();
    }
}